

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O0

put_transaction<Func> * __thiscall
density::
sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
::
start_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_put_samples(std::ostream&)::Func>
          (put_transaction<Func> *__return_storage_ptr__,
          sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
          *this)

{
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *pFVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> FVar2;
  put_transaction<Func> local_60;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *local_40;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *type_storage;
  runtime_type *type;
  Allocation push_data;
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *this_local;
  
  push_data.m_user_storage = this;
  detail::
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,16ul,8ul>
            ((Allocation *)&type,this);
  type_storage = (FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *)0x0;
  pFVar1 = detail::
           LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
           ::type_after_control((ControlBlock *)type);
  local_40 = pFVar1;
  FVar2 = detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>::make<Func>();
  pFVar1->m_align_invoke_destroy = FVar2.m_align_invoke_destroy;
  type_storage = pFVar1;
  memset((void *)push_data.m_next_ptr,0,0x10);
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<Func>::put_transaction
            (&local_60,0,
             (sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
              *)this,(Allocation *)&type);
  put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_put_samples(std::ostream&)::Func>
  ::
  put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_put_samples(std::ostream&)::Func,void>
            ((put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_put_samples(std::ostream&)::Func>
              *)__return_storage_ptr__,&local_60);
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<Func>::~put_transaction(&local_60);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();

                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }